

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O3

vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> * __thiscall
helics::HandleManager::regexSearch
          (vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
           *__return_storage_ptr__,HandleManager *this,string *regexExpression,InterfaceType type)

{
  pointer *ppGVar1;
  char *__s;
  iterator __position;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  BasicHandleInfo *__args;
  undefined7 in_register_00000009;
  long lVar5;
  long *plVar6;
  string rex;
  regex rgx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> local_78;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  iVar3 = (int)CONCAT71(in_register_00000009,type);
  if (iVar3 == 0x66) {
    lVar5 = 0xf8;
  }
  else if (iVar3 == 0x69) {
    lVar5 = 0xc0;
  }
  else {
    lVar5 = 0x88;
    if (iVar3 == 0x70) {
      lVar5 = 0x50;
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  regexExpression,0,6,"REGEX:");
  if (iVar3 == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)regexExpression,
               6,0xffffffffffffffff);
    iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(&local_98,"*");
    if (iVar3 == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace(&local_98,0,local_98._M_string_length,".*",2);
    }
    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,0x10);
    plVar6 = *(long **)((long)&(this->handles).
                               super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur + lVar5);
    if (plVar6 != (long *)0x0) {
      do {
        __s = (char *)plVar6[2];
        sVar4 = strlen(__s);
        local_78.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_78._M_begin = (char *)0x0;
        local_78.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar2 = std::__detail::
                __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (__s,__s + sVar4,&local_78,&local_50,0);
        if (local_78.
            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (bVar2) {
          __args = getHandleInfo(this,(InterfaceHandle)(BaseType)plVar6[3]);
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>::
            _M_realloc_insert<helics::GlobalHandle_const&>
                      ((vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>> *)
                       __return_storage_ptr__,__position,&__args->handle);
          }
          else {
            *__position._M_current = __args->handle;
            ppGVar1 = &(__return_storage_ptr__->
                       super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppGVar1 = *ppGVar1 + 1;
          }
        }
        plVar6 = (long *)*plVar6;
      } while (plVar6 != (long *)0x0);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<GlobalHandle> HandleManager::regexSearch(const std::string& regexExpression,
                                                     InterfaceType type) const
{
    const auto& imap = getMap(type);
    std::vector<GlobalHandle> matches;
    if (regexExpression.compare(0, 6, "REGEX:") != 0) {
        return matches;
    }

    std::string rex = regexExpression.substr(6);
    if (rex == "*") {
        rex = ".*";
    }
    try {
        const std::regex rgx(rex);
        for (const auto& mres : imap) {
            if (std::regex_match(mres.first.data(), rgx)) {
                const auto* handle = getHandleInfo(mres.second);
                matches.push_back(handle->handle);
            }
        }
    }
    catch (const std::regex_error& re) {
        throw std::invalid_argument(re.what());
    }
    return matches;
}